

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkMemBlast(Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  int *piVar5;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *pNew;
  long lVar6;
  Vec_Int_t *pVVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  
  uVar1 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar5 = (int *)malloc(400);
  vFanins->pArray = piVar5;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = p->fAsyncRst;
  pNew->fMemPorts = p->fMemPorts;
  pNew->fEasyFfs = p->fEasyFfs;
  if (0 < (p->vCis).nSize) {
    lVar10 = 0;
    do {
      iVar2 = (p->vCis).pArray[lVar10];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0035adc4;
      Wlc_ObjDup(pNew,p,iVar2,vFanins);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vCis).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar10 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar10];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0035adc4;
      Wlc_NtkMemBlast_rec(pNew,p,iVar2,vFanins);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vCos).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar10 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar10];
      lVar6 = (long)iVar2;
      if ((lVar6 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_0035adc4:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vCopies).nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vCopies).pArray[lVar6];
      if (((long)iVar2 < 1) || (pNew->nObjsAlloc <= iVar2)) goto LAB_0035adc4;
      Wlc_ObjSetCo(pNew,pNew->pObjs + iVar2,*(uint *)(p->pObjs + lVar6) >> 10 & 1);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vCos).nSize);
  }
  pVVar3 = p->vInits;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar2 = pVVar3->nSize;
    lVar10 = (long)iVar2;
    pVVar7->nSize = iVar2;
    pVVar7->nCap = iVar2;
    if (lVar10 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc(lVar10 * 4);
    }
    pVVar7->pArray = piVar5;
    memcpy(piVar5,pVVar3->pArray,lVar10 << 2);
    pNew->vInits = pVVar7;
  }
  pcVar4 = p->pInits;
  if (pcVar4 != (char *)0x0) {
    sVar8 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar4);
    pNew->pInits = pcVar9;
  }
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (int *)0x0;
  }
  free(vFanins);
  pcVar4 = p->pSpec;
  if (pcVar4 != (char *)0x0) {
    sVar8 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar4);
    pNew->pSpec = pcVar9;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemBlast( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkMemBlast_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}